

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_ObjRef_IRefID> *a)

{
  bool bVar1;
  ON_ObjRef_IRefID *this_00;
  int iVar2;
  int count;
  int local_1c;
  
  if (a->m_a != (ON_ObjRef_IRefID *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity * 400);
  }
  a->m_count = 0;
  bVar1 = ReadInt32(this,1,&local_1c);
  if (bVar1) {
    ON_SimpleArray<ON_ObjRef_IRefID>::SetCapacity(a,(long)local_1c);
    if (local_1c < 1) {
      bVar1 = true;
    }
    else {
      iVar2 = 1;
      do {
        this_00 = ON_SimpleArray<ON_ObjRef_IRefID>::AppendNew(a);
        bVar1 = ON_ObjRef_IRefID::Read(this_00,this);
        if (local_1c <= iVar2) {
          return bVar1;
        }
        iVar2 = iVar2 + 1;
      } while (bVar1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_ObjRef_IRefID>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = a.AppendNew().Read(*this);
    }
  }
  return rc;
}